

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Reverb::reset(V2Reverb *this)

{
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  float (*pafVar4) [4];
  undefined1 *puVar5;
  bool bVar6;
  
  pafVar4 = this->combl;
  puVar5 = &this->field_0x30;
  puVar3 = &this->field_0xd0;
  lVar2 = 0;
  do {
    lVar1 = 0;
    do {
      memset(*(void **)(puVar5 + lVar1 * 4),0,(ulong)*(uint *)(puVar5 + lVar1 * 4 + -4) << 2);
      *(undefined4 *)(puVar5 + lVar1 * 4 + -8) = 0;
      *(undefined4 *)((long)*pafVar4 + lVar1) = 0;
      lVar1 = lVar1 + 4;
    } while (lVar1 != 0x10);
    lVar1 = 0;
    do {
      memset(*(void **)(puVar3 + lVar1),0,(ulong)*(uint *)(puVar3 + lVar1 + -4) << 2);
      *(undefined4 *)(puVar3 + lVar1 + -8) = 0;
      lVar1 = lVar1 + 0x10;
    } while (lVar1 == 0x10);
    this->hpf[lVar2] = 0.0;
    puVar5 = puVar5 + 0x40;
    pafVar4 = pafVar4 + 1;
    puVar3 = puVar3 + 0x20;
    bVar6 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar6);
  return;
}

Assistant:

void reset()
    {
        for (int ch=0; ch < 2; ch++)
        {
            // comb
            for (int i=0; i < 4; i++)
            {
                combd[ch][i].reset();
                combl[ch][i] = 0.0f;
            }

            // allpass
            for (int i=0; i < 2; i++)
                alld[ch][i].reset();

            // low cut
            hpf[ch] = 0.0f;
        }
    }